

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

void __thiscall
t_netstd_generator::print_const_constructor
          (t_netstd_generator *this,ostream *out,
          vector<t_const_*,_std::allocator<t_const_*>_> *consts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  t_type *type;
  t_const_value *value;
  _Alloc_hider _Var3;
  ostream *poVar4;
  size_t sVar5;
  t_netstd_generator *this_00;
  pointer pptVar6;
  string name;
  string local_90;
  string local_70;
  string local_50;
  
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_90._M_dataplus._M_p,local_90._M_string_length);
  this_00 = (t_netstd_generator *)0x392059;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"static ",7);
  make_valid_csharp_identifier
            (&local_50,this_00,&(this->super_t_oop_generator).super_t_generator.program_name_);
  _Var3._M_p = local_50._M_dataplus._M_p;
  if (local_50._M_dataplus._M_p == (char *)0x0) {
    std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
  }
  else {
    sVar5 = strlen(local_50._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,_Var3._M_p,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Constants()",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  paVar1 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  pptVar6 = (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar6 !=
      (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pcVar2 = ((*pptVar6)->name_)._M_dataplus._M_p;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + ((*pptVar6)->name_)._M_string_length);
      type = (*pptVar6)->type_;
      value = (*pptVar6)->value_;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
      print_const_def_value(this,out,&local_70,type,value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  return;
}

Assistant:

void t_netstd_generator::print_const_constructor(ostream& out, vector<t_const*> consts)
{
    out << indent() << "static " << make_valid_csharp_identifier(program_name_).c_str() << "Constants()" << endl;
    scope_up(out);

    vector<t_const*>::iterator c_iter;
    for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter)
    {
        string name = (*c_iter)->get_name();
        t_type* type = (*c_iter)->get_type();
        t_const_value* value = (*c_iter)->get_value();

        print_const_def_value(out, name, type, value);
    }
    scope_down(out);
}